

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O0

vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
* LDPC4QKD::RateAdaptiveCode<unsigned_short>::compute_mother_pos_varn<unsigned_int>
            (vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             *__return_storage_ptr__,vector<unsigned_int,_std::allocator<unsigned_int>_> *colptr,
            vector<unsigned_short,_std::allocator<unsigned_short>_> *rowIdx)

{
  size_type sVar1;
  reference puVar2;
  ulong __n;
  const_reference pvVar3;
  const_reference pvVar4;
  reference this;
  uint local_84;
  value_type local_7e;
  value_type j;
  unsigned_short col;
  allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_> local_69;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_68;
  undefined1 local_49;
  unsigned_short *local_48;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_40;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_38;
  uint local_2c;
  ulong uStack_28;
  uint nMotherRows;
  size_type nCols;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *rowIdx_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *colptr_local;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  *pos_varn_tmp;
  
  nCols = (size_type)rowIdx;
  rowIdx_local = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)colptr;
  colptr_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(colptr);
  uStack_28 = sVar1 - 1;
  local_40._M_current =
       (unsigned_short *)
       std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                 ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)nCols);
  local_48 = (unsigned_short *)
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)nCols);
  local_38 = std::
             max_element<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                       (local_40,(__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                  )local_48);
  puVar2 = __gnu_cxx::
           __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
           ::operator*(&local_38);
  local_2c = *puVar2 + 1;
  local_49 = 0;
  __n = (ulong)local_2c;
  local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_68);
  std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::allocator
            (&local_69);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(__return_storage_ptr__,__n,&local_68,&local_69);
  std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::~allocator
            (&local_69);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_68);
  for (local_7e = 0; local_7e < uStack_28; local_7e = local_7e + 1) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)rowIdx_local,
                        (ulong)local_7e);
    for (local_84 = *pvVar3;
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)rowIdx_local,
                            (ulong)(local_7e + 1)), local_84 < *pvVar3; local_84 = local_84 + 1) {
      pvVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)nCols,
                          (ulong)local_84);
      this = std::
             vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             ::operator[](__return_storage_ptr__,(ulong)*pvVar4);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(this,&local_7e);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::vector<idx_t>> compute_mother_pos_varn(
                const std::vector<colptr_t> &colptr,
                const std::vector<idx_t> &rowIdx) {
            // number of columns in full matrix represented by given compressed sparse column (CSC) storage
            const auto nCols = colptr.size() - 1;
            // number of rows in full matrix represented by given compressed sparse column (CSC) storage
            const auto nMotherRows = *std::max_element(rowIdx.begin(), rowIdx.end()) + 1u;

            std::vector<std::vector<idx_t>> pos_varn_tmp{nMotherRows, std::vector<idx_t>{}};
            for (idx_t col = 0; col < nCols; col++) {
                for (auto j = colptr[col]; j < colptr[col + 1u]; j++) {
                    pos_varn_tmp[rowIdx[j]].push_back(col);
                }
            }
            return pos_varn_tmp;
        }